

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O1

int http_request(http_reply *http,char *host_name,char *port_str,char *http_string,size_t rlen)

{
  int *status;
  bool bVar1;
  addrinfo *paVar2;
  uint uVar3;
  int iVar4;
  ssize_t sVar5;
  char *pcVar6;
  __int32_t **pp_Var7;
  char *pcVar8;
  int unaff_EBP;
  char *__s;
  size_t __n;
  ulong uVar9;
  char *__s2;
  uint uVar10;
  size_t body_size;
  addrinfo *resolve_array;
  char *local_d48;
  size_t headers_num;
  http_reply *local_d38;
  int *local_d30;
  ulong local_d28;
  int http_minor;
  timeval tv;
  phr_chunked_decoder http_decoder;
  size_t msg_size;
  char *http_msg;
  addrinfo local_ce8;
  phr_header headers [100];
  size_t len;
  
  http_decoder.bytes_left_in_chunk = 0;
  http_decoder.consume_trailer = '\0';
  http_decoder._hex_count = '\0';
  http_decoder._state = '\0';
  http_decoder._11_5_ = 0;
  tv.tv_sec = (__time_t)timeout;
  tv.tv_usec = 0;
  if (v_flag != 0) {
    fprintf(_stdout,"%s: connecting to %s:%s\n",pname,host_name,port_str);
  }
  local_ce8.ai_canonname = (char *)0x0;
  local_ce8.ai_next = (addrinfo *)0x0;
  local_ce8.ai_addrlen = 0;
  local_ce8._20_4_ = 0;
  local_ce8.ai_addr = (sockaddr *)0x0;
  local_ce8.ai_socktype = 1;
  local_ce8.ai_protocol = 0;
  local_ce8.ai_flags = 0x28;
  local_ce8.ai_family = 0;
  uVar3 = getaddrinfo(host_name,port_str,&local_ce8,(addrinfo **)&resolve_array);
  paVar2 = resolve_array;
  if (uVar3 == 0) {
    while (paVar2 != (addrinfo *)0x0) {
      unaff_EBP = socket(paVar2->ai_family,paVar2->ai_socktype,paVar2->ai_protocol);
      if (-1 < unaff_EBP) {
        iVar4 = connect(unaff_EBP,(sockaddr *)paVar2->ai_addr,paVar2->ai_addrlen);
        if (-1 < iVar4) break;
        close(unaff_EBP);
      }
      paVar2 = resolve_array->ai_next;
    }
    freeaddrinfo((addrinfo *)resolve_array);
    if (paVar2 != (addrinfo *)0x0) {
      setsockopt(unaff_EBP,1,0x14,&tv,0x10);
      setsockopt(unaff_EBP,1,0x15,&tv,0x10);
      sVar5 = send(unaff_EBP,http_string,rlen,0);
      if ((int)(uint)sVar5 < 0) {
        pcVar6 = "cannot send data ";
      }
      else {
        if (((uint)sVar5 & 0x7fffffff) != rlen) {
          http_request_cold_1();
          return 1;
        }
        pcVar6 = (char *)malloc(0x400);
        sVar5 = recv(unaff_EBP,pcVar6,0x400,0);
        iVar4 = (int)sVar5;
        uVar3 = 0;
        if (iVar4 < 1) {
          len = 0;
        }
        else {
          do {
            uVar10 = (int)sVar5 + uVar3;
            len = (size_t)uVar10;
            pcVar6 = (char *)realloc(pcVar6,(ulong)((int)sVar5 + uVar3 + 0x400));
            sVar5 = recv(unaff_EBP,pcVar6 + len,0x400,0);
            iVar4 = (int)sVar5;
            uVar3 = uVar10;
          } while (0 < iVar4);
        }
        if (-1 < iVar4) {
          headers_num = 100;
          status = &http->status;
          uVar3 = phr_parse_response(pcVar6,len,&http_minor,status,&http_msg,&msg_size,headers,
                                     &headers_num,0);
          if ((int)uVar3 < 0) {
            http_request_cold_2();
          }
          else {
            local_d28 = (ulong)uVar3;
            local_d30 = status;
            if (headers_num == 0) {
              bVar1 = true;
              __s = (char *)0x0;
            }
            else {
              bVar1 = false;
              uVar9 = 0;
              __s = (char *)0x0;
              local_d38 = http;
              do {
                pcVar8 = headers[uVar9].name;
                __n = headers[uVar9].name_len;
                __s2 = pcVar8;
                local_d48 = __s;
                if (0 < (long)__n) {
                  pp_Var7 = __ctype_tolower_loc();
                  do {
                    *pcVar8 = (char)(*pp_Var7)[*pcVar8];
                    pcVar8 = pcVar8 + 1;
                    __s2 = headers[uVar9].name;
                    __n = headers[uVar9].name_len;
                  } while (pcVar8 < __s2 + __n);
                }
                iVar4 = strncmp("content-type",__s2,__n);
                if (iVar4 == 0) {
                  __s = headers[uVar9].value;
                  __s[headers[uVar9].value_len] = '\0';
                  pcVar8 = strchr(__s,0x3b);
                  if (pcVar8 != (char *)0x0) {
                    *pcVar8 = '\0';
                  }
                }
                else {
                  iVar4 = strncmp("transfer-encoding",__s2,__n);
                  __s = local_d48;
                  if ((iVar4 == 0) &&
                     (iVar4 = strncmp("chunked",headers[uVar9].value,headers[uVar9].value_len),
                     __s = local_d48, iVar4 == 0)) {
                    bVar1 = true;
                  }
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 < headers_num);
              bVar1 = !bVar1;
              http = local_d38;
            }
            if (v_flag != 0) {
              pcVar8 = "missing";
              if (__s != (char *)0x0) {
                pcVar8 = __s;
              }
              fprintf(_stdout,"%s: server response status code: %d, MIME header: %s\n",pname,
                      (ulong)(uint)*local_d30,pcVar8);
            }
            http->mime_type = __s;
            http->payload = pcVar6 + local_d28;
            body_size = len - local_d28;
            if ((bVar1) ||
               (uVar9 = phr_decode_chunked(&http_decoder,pcVar6 + local_d28,&body_size),
               -1 < (int)uVar9)) {
              http->payload[body_size] = '\0';
              http->bytes = (int)body_size;
              close(unaff_EBP);
              return 0;
            }
            fprintf(_stderr,"%i cannot decode chunked payload\n",uVar9 & 0xffffffff);
            close(unaff_EBP);
          }
          return 2;
        }
        pcVar6 = "error receiving data ";
      }
      perror(pcVar6);
      close(unaff_EBP);
      return 1;
    }
    perror("cannot connect");
  }
  else {
    fprintf(_stderr,"failed to resolve remote host address %s (err=%d)\n",host_name,(ulong)uVar3);
  }
  return 1;
}

Assistant:

int http_request(struct http_reply *http, const char* host_name, const char *port_str,
                   const char *http_string, size_t rlen)
{
	struct addrinfo hints;
	struct addrinfo *res, *resolve_array;
	int rc, sd, i;

	char *buf;
	int used, bytes, http_chunked;
	int http_minor;
	const char *http_msg;
	size_t msg_size, headers_num, header_size, body_size;
	struct phr_header headers[100];
	struct phr_chunked_decoder http_decoder = {0};
	char *mime_type;
#ifdef WIN32
	int tv=timeout*1000;
#else
	struct timeval tv;
	tv.tv_sec = timeout;
	tv.tv_usec = 0;
#endif

	if (v_flag)
		fprintf(stdout, "%s: connecting to %s:%s\n", pname, host_name, port_str);

	/* resolve name */
	memset(&hints, 0, sizeof(hints));
	hints.ai_family = AF_UNSPEC;
	hints.ai_socktype = SOCK_STREAM;
	hints.ai_protocol = 0;
	hints.ai_flags = (AI_ADDRCONFIG | AI_V4MAPPED);
	rc = getaddrinfo(host_name, port_str, &hints, &resolve_array);
	if (rc!=0) {
		fprintf(stderr, "failed to resolve remote host address %s (err=%d)\n", host_name, rc);
		return (1);
	}

	/* getaddrinfo() returns a list of address structures.
		Try each address until we successfully connect.
		If socket (or connect) fails, we close the socket
		and try the next address. */
	for (res = resolve_array;
		res != NULL;
		res = resolve_array->ai_next) {
		sd = socket(res->ai_family, res->ai_socktype, res->ai_protocol);
		if (sd < 0) {
			continue;
		}

		/* connect to server */
		/* The two socket options SO_RCVTIMEO and SO_SNDTIMEO do not work with connect
		connect has a default timeout of 120 */
		rc = connect(sd, res->ai_addr, res->ai_addrlen);
		if (rc < 0) {
			close(sd);
			continue;
		}

		/* connected, exit loop */
		break;
	}

	freeaddrinfo(resolve_array);
	if (!res ) {
		perror("cannot connect");
		return (1);
	}

	setsockopt(sd,SOL_SOCKET, SO_RCVTIMEO,(void *)&tv, sizeof(tv));
	setsockopt(sd,SOL_SOCKET, SO_SNDTIMEO,(void *)&tv, sizeof(tv));

	/* send data */
	rc = send(sd, http_string, rlen, 0);

	if (rc < 0) {
		perror("cannot send data ");
		close(sd);
		return (1);
	}
	else if(rc != rlen)
	{
		fprintf(stderr,"incomplete send\n");
		close(sd);
		return (1);
	}

	/* Get response */
	buf = (char *)malloc(1024);
        used = 0;
        while ((bytes = recv(sd,&buf[used],1024,0)) > 0) {
                used += bytes;
                buf = (char *)realloc(buf, used + 1024);
	}
	if (bytes < 0) {
		perror("error receiving data ");
		close(sd);
		return (1);
	}

	headers_num = sizeof(headers) / sizeof(headers[0]);
	rc = phr_parse_response(buf, used, &http_minor, &http->status,
			&http_msg, &msg_size, headers, &headers_num, 0);
	if (rc < 0) {
		fprintf(stderr,"cannot parse response\n");
		close(sd);
		return (2);
	}
	header_size = rc;

	mime_type = NULL;
	http_chunked = 0;
	for (i = 0; i < headers_num; i++)
	{
		char *ch;
		/* convert to lowercase as some platforms don't have strcasecmp */
		for (ch = (char *)headers[i].name; ch < headers[i].name+headers[i].name_len; ch++)
			*ch = tolower(*ch);

		if (!strncmp("content-type", headers[i].name, headers[i].name_len))
		{
			char *ptr;

			mime_type = (char *)headers[i].value;
			mime_type[headers[i].value_len] = '\0';

			if ((ptr = strchr(mime_type, ';')))
				*ptr = '\0';
		}
		else if (!strncmp("transfer-encoding", headers[i].name, headers[i].name_len) &&
			!strncmp("chunked", headers[i].value, headers[i].value_len))
		{
			http_chunked = 1;
		}
	}

	if (v_flag)
		fprintf(stdout, "%s: server response status code: %d, MIME header: %s\n",
			pname, http->status, mime_type ? mime_type : "missing");

	http->mime_type = mime_type;
	http->payload = buf+header_size;
	body_size = used-header_size;

	if (http_chunked)
	{
		rc = phr_decode_chunked(&http_decoder, http->payload, &body_size);
		if (rc < 0) {
			fprintf(stderr,"%i cannot decode chunked payload\n", rc);
			close(sd);
			return (2);
		}
	}

	http->payload[body_size] = '\0';
	http->bytes = body_size;

#ifdef WIN32
	closesocket(sd);
#else
	close(sd);
#endif
	return (0);
}